

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

hts_itr_t * hts_itr_query(hts_idx_t *idx,int tid,int beg,int end,hts_readrec_func *readrec)

{
  khint_t kVar1;
  bidx_t *pbVar2;
  bins_t *pbVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  hts_itr_t *phVar10;
  ulong uVar11;
  int *piVar12;
  hts_pair64_t *a;
  uint64_t *puVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  khint_t k_1;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  bool bVar32;
  uint local_78;
  int local_70;
  
  if (-1 < tid) {
    uVar11 = (ulong)(uint)beg;
    if (beg < 1) {
      uVar11 = 0;
    }
    uVar8 = (uint)uVar11;
    if (end < (int)uVar8) {
      return (hts_itr_t *)0x0;
    }
    if (idx->n <= tid) {
      return (hts_itr_t *)0x0;
    }
    pbVar2 = idx->bidx[(uint)tid];
    if (pbVar2 == (bidx_t *)0x0) {
      return (hts_itr_t *)0x0;
    }
    phVar10 = (hts_itr_t *)calloc(1,0x50);
    phVar10->tid = tid;
    phVar10->beg = uVar8;
    phVar10->end = end;
    phVar10->i = -1;
    phVar10->readrec = readrec;
    iVar17 = idx->n_lvls;
    uVar23 = (uVar8 >> ((byte)idx->min_shift & 0x1f)) +
             (uint)((ulong)(uint)~(-1 << ((char)iVar17 * '\x03' & 0x1fU)) * 0x92492493 >> 0x22);
    uVar26 = pbVar2->n_buckets;
    uVar19 = uVar26 - 1;
    do {
      if (uVar26 == 0) {
        uVar31 = 0;
      }
      else {
        iVar28 = 1;
        uVar20 = uVar19 & uVar23;
        do {
          bVar14 = (char)uVar20 * '\x02' & 0x1e;
          uVar31 = pbVar2->flags[uVar20 >> 4] >> bVar14;
          if (((uVar31 & 2) != 0) || (((uVar31 & 1) == 0 && (pbVar2->keys[uVar20] == uVar23)))) {
            uVar31 = uVar20;
            if ((pbVar2->flags[uVar20 >> 4] >> bVar14 & 3) != 0) {
              uVar31 = uVar26;
            }
            break;
          }
          uVar20 = uVar20 + iVar28 & uVar19;
          iVar28 = iVar28 + 1;
          uVar31 = uVar26;
        } while (uVar20 != (uVar19 & uVar23));
      }
      if (uVar31 == uVar26) {
        uVar20 = uVar23 - 1;
        bVar32 = (int)((uVar20 & 0xfffffff8) + 1) < (int)uVar23;
        uVar23 = (int)uVar20 >> 3;
        if (bVar32) {
          uVar23 = uVar20;
        }
      }
    } while ((uVar31 == uVar26) && (uVar23 != 0));
    if (uVar23 == 0) {
      uVar31 = 0;
    }
    if ((uVar26 != 0) && (uVar23 == 0)) {
      uVar23 = 0;
      iVar28 = 1;
      do {
        bVar14 = (char)uVar23 * '\x02' & 0x1e;
        uVar31 = pbVar2->flags[uVar23 >> 4] >> bVar14;
        if (((uVar31 & 2) != 0) || (((uVar31 & 1) == 0 && (pbVar2->keys[uVar23] == 0)))) {
          uVar31 = uVar23;
          if ((pbVar2->flags[uVar23 >> 4] >> bVar14 & 3) != 0) {
            uVar31 = uVar26;
          }
          break;
        }
        uVar23 = uVar23 + iVar28;
        iVar28 = iVar28 + 1;
        uVar23 = uVar23 & uVar19;
        uVar31 = uVar26;
      } while (uVar23 != 0);
    }
    if (uVar31 == uVar26) {
      uVar18 = 0;
    }
    else {
      uVar18 = pbVar2->vals[uVar31].loff;
    }
    if ((int)uVar8 < end) {
      iVar28 = idx->min_shift + iVar17 + iVar17 * 2;
      lVar24 = 1L << ((byte)iVar28 & 0x3f);
      if (end <= lVar24) {
        lVar24 = (long)end;
      }
      if (-1 < iVar17) {
        iVar27 = (phVar10->bins).n;
        local_70 = (phVar10->bins).m;
        iVar9 = 0;
        iVar29 = 0;
        do {
          iVar5 = (int)(uVar11 >> ((byte)iVar28 & 0x3f));
          iVar15 = iVar9 + iVar5;
          iVar6 = (int)(lVar24 + -1 >> ((byte)iVar28 & 0x3f));
          iVar30 = iVar9 + iVar6;
          iVar7 = iVar30 - iVar15;
          if (local_70 < iVar7 + iVar27 + 1) {
            uVar8 = iVar7 + iVar27;
            uVar8 = (int)uVar8 >> 1 | uVar8;
            uVar8 = (int)uVar8 >> 2 | uVar8;
            uVar8 = (int)uVar8 >> 4 | uVar8;
            uVar8 = (int)uVar8 >> 8 | uVar8;
            uVar8 = (int)uVar8 >> 0x10 | uVar8;
            local_70 = uVar8 + 1;
            piVar12 = (int *)realloc((phVar10->bins).a,(long)(int)uVar8 * 4 + 4);
            (phVar10->bins).a = piVar12;
          }
          if (iVar15 <= iVar30) {
            piVar12 = (phVar10->bins).a;
            lVar16 = 0;
            do {
              piVar12[iVar27 + lVar16] = iVar15 + (int)lVar16;
              lVar16 = lVar16 + 1;
            } while ((iVar6 - iVar5) + 1 != (int)lVar16);
            iVar27 = iVar27 + (int)lVar16;
          }
          iVar28 = iVar28 + -3;
          iVar9 = (1 << ((char)iVar29 * '\x03' & 0x1fU)) + iVar9;
          bVar32 = iVar29 != iVar17;
          iVar29 = iVar29 + 1;
        } while (bVar32);
        (phVar10->bins).n = iVar27;
        (phVar10->bins).m = local_70;
      }
    }
    iVar17 = (phVar10->bins).n;
    lVar24 = (long)iVar17;
    if (lVar24 < 1) {
      iVar28 = 0;
    }
    else {
      kVar1 = pbVar2->n_buckets;
      lVar16 = 0;
      iVar28 = 0;
      do {
        uVar8 = 0;
        if (kVar1 != 0) {
          uVar19 = (phVar10->bins).a[lVar16];
          uVar23 = kVar1 - 1 & uVar19;
          iVar27 = 1;
          uVar26 = uVar23;
          do {
            bVar14 = (char)uVar26 * '\x02' & 0x1e;
            uVar8 = pbVar2->flags[uVar26 >> 4] >> bVar14;
            if (((uVar8 & 2) != 0) || (((uVar8 & 1) == 0 && (pbVar2->keys[uVar26] == uVar19)))) {
              uVar8 = uVar26;
              if ((pbVar2->flags[uVar26 >> 4] >> bVar14 & 3) != 0) {
                uVar8 = kVar1;
              }
              break;
            }
            uVar26 = uVar26 + iVar27 & kVar1 - 1;
            iVar27 = iVar27 + 1;
            uVar8 = kVar1;
          } while (uVar26 != uVar23);
        }
        if (uVar8 != kVar1) {
          iVar28 = iVar28 + pbVar2->vals[uVar8].n;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar24);
    }
    if (iVar28 == 0) {
      return phVar10;
    }
    a = (hts_pair64_t *)calloc((long)iVar28,0x10);
    if (iVar17 < 1) {
      uVar8 = 0;
    }
    else {
      piVar12 = (phVar10->bins).a;
      lVar16 = 0;
      uVar8 = 0;
      do {
        uVar19 = pbVar2->n_buckets;
        uVar26 = 0;
        if (uVar19 != 0) {
          uVar23 = piVar12[lVar16];
          uVar20 = uVar19 - 1 & uVar23;
          iVar17 = 1;
          uVar31 = uVar20;
          do {
            bVar14 = (char)uVar31 * '\x02' & 0x1e;
            uVar26 = pbVar2->flags[uVar31 >> 4] >> bVar14;
            if (((uVar26 & 2) != 0) || (((uVar26 & 1) == 0 && (pbVar2->keys[uVar31] == uVar23)))) {
              uVar26 = uVar31;
              if ((pbVar2->flags[uVar31 >> 4] >> bVar14 & 3) != 0) {
                uVar26 = uVar19;
              }
              break;
            }
            uVar31 = uVar31 + iVar17 & uVar19 - 1;
            iVar17 = iVar17 + 1;
            uVar26 = uVar19;
          } while (uVar31 != uVar20);
        }
        if (uVar26 != uVar19) {
          pbVar3 = pbVar2->vals;
          if (0 < pbVar3[uVar26].n) {
            lVar21 = 8;
            lVar22 = 0;
            do {
              if (uVar18 < *(ulong *)((long)&(pbVar3[uVar26].list)->u + lVar21)) {
                puVar13 = (uint64_t *)((long)&(pbVar3[uVar26].list)->u + lVar21);
                lVar25 = (long)(int)uVar8;
                uVar8 = uVar8 + 1;
                uVar4 = *puVar13;
                a[lVar25].u = puVar13[-1];
                a[lVar25].v = uVar4;
              }
              lVar22 = lVar22 + 1;
              lVar21 = lVar21 + 0x10;
            } while (lVar22 < pbVar3[uVar26].n);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar24);
    }
    if (uVar8 == 0) {
      free(a);
      return phVar10;
    }
    ks_introsort__off((long)(int)uVar8,a);
    uVar19 = 0;
    if (1 < (int)uVar8) {
      lVar24 = 0;
      uVar19 = 0;
      do {
        if (a[(int)uVar19].v < *(ulong *)((long)&a[1].v + lVar24)) {
          uVar4 = *(uint64_t *)((long)&a[1].v + lVar24);
          a[(long)(int)uVar19 + 1].u = *(uint64_t *)((long)&a[1].u + lVar24);
          a[(long)(int)uVar19 + 1].v = uVar4;
          uVar19 = uVar19 + 1;
        }
        lVar24 = lVar24 + 0x10;
      } while ((ulong)uVar8 * 0x10 + -0x10 != lVar24);
    }
    if (0 < (int)uVar19) {
      lVar24 = 0;
      do {
        uVar11 = *(ulong *)((long)&a[1].u + lVar24);
        if (uVar11 <= *(ulong *)((long)&a->v + lVar24)) {
          *(ulong *)((long)&a->v + lVar24) = uVar11;
        }
        lVar24 = lVar24 + 0x10;
      } while ((ulong)uVar19 << 4 != lVar24);
    }
    if ((int)uVar19 < 1) {
      iVar17 = 1;
    }
    else {
      iVar17 = 0;
      lVar24 = 0x10;
      do {
        if ((*(ulong *)((long)&a->u + lVar24) ^ a[iVar17].v) < 0x10000) {
          a[iVar17].v = *(uint64_t *)((long)&a->v + lVar24);
        }
        else {
          puVar13 = (uint64_t *)((long)&a->u + lVar24);
          uVar4 = puVar13[1];
          a[(long)iVar17 + 1].u = *puVar13;
          a[(long)iVar17 + 1].v = uVar4;
          iVar17 = iVar17 + 1;
        }
        lVar24 = lVar24 + 0x10;
      } while ((ulong)uVar19 * 0x10 + 0x10 != lVar24);
      iVar17 = iVar17 + 1;
    }
    phVar10->n_off = iVar17;
    phVar10->off = a;
    return phVar10;
  }
  uVar11 = 0;
  local_78 = 1;
  switch(tid) {
  case -5:
    local_78 = 3;
    uVar11 = 0;
    break;
  case -4:
    break;
  case -3:
    if ((long)idx->n < 1) {
      uVar11 = 0xffffffffffffffff;
    }
    else {
      uVar8 = idx->n_bins + 1;
      uVar11 = 0xffffffffffffffff;
      lVar24 = 0;
      do {
        pbVar2 = idx->bidx[lVar24];
        kVar1 = pbVar2->n_buckets;
        uVar19 = 0;
        if (kVar1 != 0) {
          uVar23 = kVar1 - 1 & uVar8;
          iVar17 = 1;
          uVar26 = uVar23;
          do {
            bVar14 = (char)uVar26 * '\x02' & 0x1e;
            uVar19 = pbVar2->flags[uVar26 >> 4] >> bVar14;
            if (((uVar19 & 2) != 0) || (((uVar19 & 1) == 0 && (pbVar2->keys[uVar26] == uVar8)))) {
              uVar19 = uVar26;
              if ((pbVar2->flags[uVar26 >> 4] >> bVar14 & 3) != 0) {
                uVar19 = kVar1;
              }
              break;
            }
            uVar26 = uVar26 + iVar17 & kVar1 - 1;
            iVar17 = iVar17 + 1;
            uVar19 = kVar1;
          } while (uVar26 != uVar23);
        }
        if ((uVar19 != kVar1) && (uVar18 = (pbVar2->vals[uVar19].list)->u, uVar18 <= uVar11)) {
          uVar11 = uVar18;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != idx->n);
    }
    if (uVar11 == 0xffffffffffffffff) {
      uVar4 = idx->n_no_coor;
LAB_00111350:
      uVar11 = -(ulong)(uVar4 == 0);
    }
    break;
  case -2:
    uVar11 = 0xffffffffffffffff;
    if (0 < (long)idx->n) {
      pbVar2 = idx->bidx[(long)idx->n + -1];
      uVar8 = pbVar2->n_buckets;
      if (uVar8 == 0) {
        uVar19 = 0;
      }
      else {
        uVar23 = idx->n_bins + 1;
        uVar31 = uVar8 - 1 & uVar23;
        iVar17 = 1;
        uVar26 = uVar31;
        do {
          bVar14 = (char)uVar26 * '\x02' & 0x1e;
          uVar19 = pbVar2->flags[uVar26 >> 4] >> bVar14;
          if (((uVar19 & 2) != 0) || (((uVar19 & 1) == 0 && (pbVar2->keys[uVar26] == uVar23)))) {
            uVar19 = uVar26;
            if ((pbVar2->flags[uVar26 >> 4] >> bVar14 & 3) != 0) {
              uVar19 = uVar8;
            }
            break;
          }
          uVar26 = uVar26 + iVar17 & uVar8 - 1;
          iVar17 = iVar17 + 1;
          uVar19 = uVar8;
        } while (uVar26 != uVar31);
      }
      uVar11 = 0xffffffffffffffff;
      if (uVar19 != uVar8) {
        uVar11 = (pbVar2->vals[uVar19].list)->v;
      }
    }
    if (uVar11 == 0xffffffffffffffff) {
      uVar4 = idx->n_no_coor;
      goto LAB_00111350;
    }
    break;
  default:
    goto switchD_00110d3f_default;
  }
  if (uVar11 != 0xffffffffffffffff) {
    phVar10 = (hts_itr_t *)calloc(1,0x50);
    *(uint *)phVar10 = local_78 | *(uint *)phVar10 & 0xfffffffc;
    phVar10->curr_off = uVar11;
    phVar10->readrec = readrec;
    return phVar10;
  }
switchD_00110d3f_default:
  return (hts_itr_t *)0x0;
}

Assistant:

hts_itr_t *hts_itr_query(const hts_idx_t *idx, int tid, int beg, int end, hts_readrec_func *readrec)
{
    int i, n_off, l, bin;
    hts_pair64_t *off;
    khint_t k;
    bidx_t *bidx;
    uint64_t min_off;
    hts_itr_t *iter = 0;
    if (tid < 0) {
        int finished0 = 0;
        uint64_t off0 = (uint64_t)-1;
        khint_t k;
        switch (tid) {
        case HTS_IDX_START:
            // Find the smallest offset, note that sequence ids may not be ordered sequentially
            for (i=0; i<idx->n; i++)
            {
                bidx = idx->bidx[i];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k == kh_end(bidx)) continue;
                if ( off0 > kh_val(bidx, k).list[0].u ) off0 = kh_val(bidx, k).list[0].u;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_NOCOOR:
            if ( idx->n>0 )
            {
                bidx = idx->bidx[idx->n - 1];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k != kh_end(bidx)) off0 = kh_val(bidx, k).list[0].v;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_REST:
            off0 = 0;
            break;

        case HTS_IDX_NONE:
            finished0 = 1;
            off0 = 0;
            break;

        default:
            return 0;
        }
        if (off0 != (uint64_t)-1) {
            iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
            iter->read_rest = 1;
            iter->finished = finished0;
            iter->curr_off = off0;
            iter->readrec = readrec;
            return iter;
        } else return 0;
    }

    if (beg < 0) beg = 0;
    if (end < beg) return 0;
    if (tid >= idx->n || (bidx = idx->bidx[tid]) == NULL) return 0;

    iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
    iter->tid = tid, iter->beg = beg, iter->end = end; iter->i = -1;
    iter->readrec = readrec;

    // compute min_off
    bin = hts_bin_first(idx->n_lvls) + (beg>>idx->min_shift);
    do {
        int first;
        k = kh_get(bin, bidx, bin);
        if (k != kh_end(bidx)) break;
        first = (hts_bin_parent(bin)<<3) + 1;
        if (bin > first) --bin;
        else bin = hts_bin_parent(bin);
    } while (bin);
    if (bin == 0) k = kh_get(bin, bidx, bin);
    min_off = k != kh_end(bidx)? kh_val(bidx, k).loff : 0;
    // retrieve bins
    reg2bins(beg, end, iter, idx->min_shift, idx->n_lvls);
    for (i = n_off = 0; i < iter->bins.n; ++i)
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx))
            n_off += kh_value(bidx, k).n;
    if (n_off == 0) return iter;
    off = (hts_pair64_t*)calloc(n_off, sizeof(hts_pair64_t));
    for (i = n_off = 0; i < iter->bins.n; ++i) {
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx)) {
            int j;
            bins_t *p = &kh_value(bidx, k);
            for (j = 0; j < p->n; ++j)
                if (p->list[j].v > min_off) off[n_off++] = p->list[j];
        }
    }
    if (n_off == 0) {
        free(off); return iter;
    }
    ks_introsort(_off, n_off, off);
    // resolve completely contained adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i)
        if (off[l].v < off[i].v) off[++l] = off[i];
    n_off = l + 1;
    // resolve overlaps between adjacent blocks; this may happen due to the merge in indexing
    for (i = 1; i < n_off; ++i)
        if (off[i-1].v >= off[i].u) off[i-1].v = off[i].u;
    // merge adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i) {
        if (off[l].v>>16 == off[i].u>>16) off[l].v = off[i].v;
        else off[++l] = off[i];
    }
    n_off = l + 1;
    iter->n_off = n_off; iter->off = off;
    return iter;
}